

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>::Print
               (unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *value,ostream *os)

{
  ostream *os_local;
  unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_> *value_local;
  
  PrintTo<SDL_Texture,std::function<void(SDL_Texture*)>>(value,os);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }